

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_2::SequentialFileImpl::Skip(SequentialFileImpl *this,uint64_t n)

{
  long lVar1;
  FileState *pFVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong in_RDX;
  Slice *in_RSI;
  Slice *in_RDI;
  long in_FS_OFFSET;
  uint64_t available;
  Slice *msg;
  FileState *this_00;
  ulong local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (FileState *)in_RSI[1].data_;
  msg = in_RDI;
  pFVar2 = (FileState *)FileState::Size(this_00);
  if (pFVar2 < this_00) {
    Slice::Slice(in_RSI,(char *)msg);
    Slice::Slice(in_RDI);
    Status::IOError(msg,in_RDI);
  }
  else {
    uVar3 = FileState::Size(this_00);
    uVar4 = uVar3 - (long)in_RSI[1].data_;
    local_40 = in_RDX;
    if (uVar4 < in_RDX) {
      local_40 = uVar4;
    }
    in_RSI[1].data_ = in_RSI[1].data_ + local_40;
    Status::OK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)msg;
  }
  __stack_chk_fail();
}

Assistant:

Status Skip(uint64_t n) override {
    if (pos_ > file_->Size()) {
      return Status::IOError("pos_ > file_->Size()");
    }
    const uint64_t available = file_->Size() - pos_;
    if (n > available) {
      n = available;
    }
    pos_ += n;
    return Status::OK();
  }